

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O3

void __thiscall Assimp::MD5Importer::LoadMD5MeshFile(MD5Importer *this)

{
  aiString *pInput;
  aiVertexWeight **ppaVar1;
  int *piVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar9;
  undefined4 uVar13;
  undefined4 uVar14;
  pointer pcVar15;
  IOSystem *pIVar16;
  pointer pWVar17;
  aiVector3D *paVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  char *__src;
  aiVector3D **ppaVar24;
  int iVar25;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiNode *paVar26;
  aiNode **ppaVar27;
  MeshDesc *pMVar28;
  aiScene *paVar29;
  aiMesh **ppaVar30;
  aiMaterial **ppaVar31;
  uint *puVar32;
  ulong uVar33;
  aiMesh *paVar34;
  aiVector3D *paVar35;
  void *__s;
  pointer pVVar36;
  aiBone **ppaVar37;
  aiBone *paVar38;
  aiVertexWeight *paVar39;
  Logger *pLVar40;
  ulong *puVar41;
  aiFace *paVar42;
  aiMaterial *this_00;
  char *pcVar43;
  runtime_error *this_01;
  aiFace *paVar44;
  uint uVar45;
  uint uVar46;
  ulong uVar47;
  pointer pBVar48;
  pointer pVVar49;
  MD5Importer *pMVar50;
  float *pfVar51;
  pointer pBVar52;
  uint uVar53;
  long lVar54;
  pointer meshSrc;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  string pFile;
  MD5MeshParser meshParser;
  string name;
  MD5Parser parser;
  aiString temp;
  uint local_930;
  uint local_92c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  char *local_908;
  MeshDesc *local_900;
  MD5Importer *local_8f8;
  void *local_8f0;
  uint local_8e4;
  aiVector3D **local_8e0;
  aiBone ***local_8d8;
  MD5MeshParser local_8d0;
  long *local_8a0;
  ulong local_898;
  long local_890 [2];
  ulong local_880;
  char *local_878;
  long local_870;
  pointer local_868;
  MD5Parser local_860;
  undefined1 local_838 [1028];
  uint local_434;
  undefined1 local_430 [1024];
  IOStream *file;
  
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  pcVar15 = (this->mFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_928,pcVar15,pcVar15 + (this->mFile)._M_string_length);
  std::__cxx11::string::append((char *)&local_928);
  pIVar16 = this->pIOHandler;
  local_838._0_8_ = local_838 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"rb","");
  iVar25 = (*pIVar16->_vptr_IOSystem[4])(pIVar16,local_928._M_dataplus._M_p,local_838._0_8_);
  file = (IOStream *)CONCAT44(extraout_var,iVar25);
  if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
    operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
  }
  if ((file == (IOStream *)0x0) ||
     (iVar25 = (*file->_vptr_IOStream[6])(file), CONCAT44(extraout_var_00,iVar25) == 0)) {
    pLVar40 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838,
                   "Failed to access MD5MESH file: ",&local_928);
    Logger::warn(pLVar40,(char *)local_838._0_8_);
    if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
      operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
    }
  }
  else {
    this->bHadMD5Mesh = true;
    LoadFileIntoMemory(this,file);
    MD5::MD5Parser::MD5Parser(&local_860,this->mBuffer,this->fileSize);
    MD5::MD5MeshParser::MD5MeshParser(&local_8d0,&local_860.mSections);
    paVar26 = (aiNode *)operator_new(0x478);
    local_838._0_8_ = local_838 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"<MD5_Root>","");
    aiNode::aiNode(paVar26,(string *)local_838);
    this->pScene->mRootNode = paVar26;
    if ((undefined1 *)local_838._0_8_ != local_838 + 0x10) {
      operator_delete((void *)local_838._0_8_,local_838._16_8_ + 1);
    }
    this->pScene->mRootNode->mNumChildren = 2;
    ppaVar27 = (aiNode **)operator_new__(0x10);
    this->pScene->mRootNode->mChildren = ppaVar27;
    paVar26 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar26);
    this->pScene->mRootNode->mChildren[1] = paVar26;
    (paVar26->mName).length = 0xf;
    builtin_strncpy((paVar26->mName).data,"<MD5_Hierarchy>",0x10);
    paVar26->mParent = this->pScene->mRootNode;
    AttachChilds_Mesh(this,-1,paVar26,&local_8d0.mJoints);
    paVar26 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar26);
    meshSrc = local_8d0.mMeshes.
              super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    *this->pScene->mRootNode->mChildren = paVar26;
    (paVar26->mName).length = 10;
    builtin_strncpy((paVar26->mName).data,"<MD5_Mesh>",0xb);
    paVar29 = this->pScene;
    paVar26->mParent = paVar29->mRootNode;
    local_900 = local_8d0.mMeshes.
                super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    pMVar28 = local_8d0.mMeshes.
              super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_8d0.mMeshes.
        super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_8d0.mMeshes.
        super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if (((pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pMVar28->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           ((pMVar28->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pMVar28->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          puVar32 = &this->pScene->mNumMaterials;
          *puVar32 = *puVar32 + 1;
        }
        pMVar28 = pMVar28 + 1;
      } while (pMVar28 !=
               local_8d0.mMeshes.
               super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      paVar29 = this->pScene;
    }
    paVar29->mNumMeshes = paVar29->mNumMaterials;
    paVar29 = this->pScene;
    ppaVar30 = (aiMesh **)operator_new__((ulong)paVar29->mNumMeshes << 3);
    paVar29->mMeshes = ppaVar30;
    paVar29 = this->pScene;
    ppaVar31 = (aiMaterial **)operator_new__((ulong)paVar29->mNumMeshes << 3);
    paVar29->mMaterials = ppaVar31;
    uVar53 = this->pScene->mNumMeshes;
    paVar26->mNumMeshes = uVar53;
    puVar32 = (uint *)operator_new__((ulong)uVar53 << 2);
    paVar26->mMeshes = puVar32;
    if (uVar53 != 0) {
      uVar33 = 0;
      do {
        paVar26->mMeshes[uVar33] = (uint)uVar33;
        uVar33 = uVar33 + 1;
      } while (uVar33 < paVar26->mNumMeshes);
      local_900 = local_8d0.mMeshes.
                  super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      meshSrc = local_8d0.mMeshes.
                super__Vector_base<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    if (meshSrc != local_900) {
      local_930 = 0;
      local_8f8 = this;
      do {
        if (((meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           ((meshSrc->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (meshSrc->mVertices).
            super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          paVar34 = (aiMesh *)operator_new(0x520);
          paVar34->mPrimitiveTypes = 0;
          paVar34->mNumVertices = 0;
          paVar34->mNumFaces = 0;
          local_8e0 = &paVar34->mVertices;
          memset(local_8e0,0,0xcc);
          paVar34->mBones = (aiBone **)0x0;
          paVar34->mMaterialIndex = 0;
          (paVar34->mName).length = 0;
          (paVar34->mName).data[0] = '\0';
          memset((paVar34->mName).data + 1,0x1b,0x3ff);
          paVar34->mNumAnimMeshes = 0;
          paVar34->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar34->mMethod = 0;
          (paVar34->mAABB).mMin.x = 0.0;
          (paVar34->mAABB).mMin.y = 0.0;
          (paVar34->mAABB).mMin.z = 0.0;
          (paVar34->mAABB).mMax.x = 0.0;
          (paVar34->mAABB).mMax.y = 0.0;
          (paVar34->mAABB).mMax.z = 0.0;
          pMVar50 = (MD5Importer *)paVar34->mColors;
          memset(pMVar50,0,0xa0);
          this->pScene->mMeshes[local_930] = paVar34;
          paVar34->mPrimitiveTypes = 4;
          MakeDataUnique(pMVar50,meshSrc);
          local_908 = (meshSrc->mShader).data;
          local_880 = (ulong)local_930;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a0,local_908,(allocator<char> *)local_838);
          std::__cxx11::string::append((char *)&local_8a0);
          uVar33 = local_898;
          ppaVar24 = local_8e0;
          if (local_898 < 0x400) {
            (paVar34->mName).length = (ai_uint32)local_898;
            memcpy((paVar34->mName).data,local_8a0,local_898);
            (paVar34->mName).data[uVar33] = '\0';
          }
          uVar47 = (long)(meshSrc->mVertices).
                         super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(meshSrc->mVertices).
                         super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          uVar53 = (uint)uVar47;
          paVar34->mNumVertices = uVar53;
          uVar47 = uVar47 & 0xffffffff;
          uVar33 = uVar47 * 0xc;
          paVar35 = (aiVector3D *)operator_new__(uVar33);
          if (uVar47 != 0) {
            memset(paVar35,0,((uVar33 - 0xc) / 0xc) * 0xc + 0xc);
          }
          *ppaVar24 = paVar35;
          paVar35 = (aiVector3D *)operator_new__(uVar33);
          if (uVar53 != 0) {
            memset(paVar35,0,((uVar33 - 0xc) / 0xc) * 0xc + 0xc);
          }
          pBVar52 = local_8d0.mJoints.
                    super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar48 = local_8d0.mJoints.
                    super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar34->mTextureCoords[0] = paVar35;
          paVar34->mNumUVComponents[0] = 2;
          pVVar36 = (meshSrc->mVertices).
                    super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pVVar36 !=
              (meshSrc->mVertices).
              super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            do {
              paVar35->x = (pVVar36->mUV).x;
              paVar35->y = 1.0 - (pVVar36->mUV).y;
              paVar35->z = 0.0;
              pVVar36 = pVVar36 + 1;
              paVar35 = paVar35 + 1;
            } while (pVVar36 !=
                     (meshSrc->mVertices).
                     super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          lVar54 = (long)local_8d0.mJoints.
                         super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_8d0.mJoints.
                         super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2;
          uVar47 = lVar54 * 0x5bda93fc9916f6a5;
          uVar33 = lVar54 * 0x6f6a4ff2645bda94;
          __s = operator_new__(-(ulong)(uVar47 >> 0x3e != 0) | uVar33);
          memset(__s,0,uVar33);
          pVVar36 = (meshSrc->mVertices).
                    super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pVVar49 = (meshSrc->mVertices).
                    super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pVVar36 != pVVar49) {
            do {
              uVar53 = pVVar36->mFirstWeight;
              uVar33 = (ulong)uVar53;
              uVar45 = pVVar36->mNumWeights;
              if (uVar53 < uVar45 + uVar53) {
                lVar54 = uVar33 * 0x14 + 4;
                do {
                  pWVar17 = (meshSrc->mWeights).
                            super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  fVar55 = *(float *)((long)&pWVar17->mBone + lVar54);
                  if ((1.1920929e-07 <= fVar55) || (fVar55 < -1.1920929e-07)) {
                    piVar2 = (int *)((long)__s + (ulong)*(uint *)((long)pWVar17 + lVar54 + -4) * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar45 = pVVar36->mNumWeights;
                  }
                  uVar33 = uVar33 + 1;
                  lVar54 = lVar54 + 0x14;
                } while (uVar33 < uVar53 + uVar45);
                pVVar49 = (meshSrc->mVertices).
                          super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              pVVar36 = pVVar36 + 1;
            } while (pVVar36 != pVVar49);
          }
          if (pBVar52 != pBVar48) {
            uVar33 = 0;
            do {
              if (*(int *)((long)__s + uVar33 * 4) != 0) {
                paVar34->mNumBones = paVar34->mNumBones + 1;
              }
              uVar33 = uVar33 + 1;
            } while ((uVar33 & 0xffffffff) <= uVar47 && uVar47 - (uVar33 & 0xffffffff) != 0);
          }
          if ((ulong)paVar34->mNumBones != 0) {
            ppaVar37 = (aiBone **)operator_new__((ulong)paVar34->mNumBones << 3);
            local_8d8 = &paVar34->mBones;
            *local_8d8 = ppaVar37;
            local_8f0 = __s;
            if (pBVar52 != pBVar48) {
              uVar33 = 0;
              uVar53 = 1;
              local_92c = 0;
              do {
                if (*(int *)((long)local_8f0 + uVar33 * 4) != 0) {
                  local_8e4 = uVar53;
                  paVar38 = (aiBone *)operator_new(0x450);
                  (paVar38->mName).length = 0;
                  (paVar38->mName).data[0] = '\0';
                  memset((paVar38->mName).data + 1,0x1b,0x3ff);
                  paVar38->mWeights = (aiVertexWeight *)0x0;
                  (paVar38->mOffsetMatrix).a1 = 1.0;
                  (paVar38->mOffsetMatrix).a2 = 0.0;
                  (paVar38->mOffsetMatrix).a3 = 0.0;
                  (paVar38->mOffsetMatrix).a4 = 0.0;
                  (paVar38->mOffsetMatrix).b1 = 0.0;
                  (paVar38->mOffsetMatrix).b2 = 1.0;
                  (paVar38->mOffsetMatrix).b3 = 0.0;
                  (paVar38->mOffsetMatrix).b4 = 0.0;
                  (paVar38->mOffsetMatrix).c1 = 0.0;
                  (paVar38->mOffsetMatrix).c2 = 0.0;
                  (paVar38->mOffsetMatrix).c3 = 1.0;
                  (paVar38->mOffsetMatrix).c4 = 0.0;
                  (paVar38->mOffsetMatrix).d1 = 0.0;
                  (paVar38->mOffsetMatrix).d2 = 0.0;
                  (paVar38->mOffsetMatrix).d3 = 0.0;
                  (paVar38->mOffsetMatrix).d4 = 1.0;
                  (*local_8d8)[local_92c] = paVar38;
                  uVar53 = *(uint *)((long)local_8f0 + uVar33 * 4);
                  paVar38->mNumWeights = uVar53;
                  paVar39 = (aiVertexWeight *)operator_new__((ulong)uVar53 << 3);
                  if (uVar53 != 0) {
                    memset(paVar39,0,(ulong)uVar53 << 3);
                  }
                  local_878 = (paVar38->mName).data;
                  paVar38->mWeights = paVar39;
                  local_870 = uVar33 * 0x4b4;
                  local_868 = local_8d0.mJoints.
                              super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  pBVar48 = local_8d0.mJoints.
                            super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar33;
                  uVar53 = (pBVar48->super_BaseJointDescription).mName.length;
                  if (0x3fe < uVar53) {
                    uVar53 = 0x3ff;
                  }
                  uVar33 = (ulong)uVar53;
                  local_838._0_4_ = uVar53;
                  memcpy(local_838 + 4,(pBVar48->super_BaseJointDescription).mName.data,uVar33);
                  local_838[uVar33 + 4] = 0;
                  (paVar38->mName).length = uVar53;
                  memcpy(local_878,local_838 + 4,uVar33);
                  uVar53 = local_8e4;
                  (paVar38->mName).data[uVar33] = '\0';
                  fVar20 = (pBVar48->mInvTransform).a1;
                  fVar21 = (pBVar48->mInvTransform).a2;
                  fVar22 = (pBVar48->mInvTransform).a3;
                  fVar23 = (pBVar48->mInvTransform).a4;
                  fVar61 = (pBVar48->mInvTransform).b1;
                  fVar62 = (pBVar48->mInvTransform).b2;
                  fVar63 = (pBVar48->mInvTransform).b3;
                  fVar19 = (pBVar48->mInvTransform).b4;
                  fVar57 = (pBVar48->mInvTransform).c1;
                  fVar58 = (pBVar48->mInvTransform).c2;
                  fVar59 = (pBVar48->mInvTransform).c3;
                  fVar60 = (pBVar48->mInvTransform).c4;
                  fVar55 = (pBVar48->mInvTransform).d2;
                  fVar56 = (pBVar48->mInvTransform).d3;
                  fVar3 = (pBVar48->mInvTransform).d4;
                  (paVar38->mOffsetMatrix).d1 = (pBVar48->mInvTransform).d1;
                  (paVar38->mOffsetMatrix).d2 = fVar55;
                  (paVar38->mOffsetMatrix).d3 = fVar56;
                  (paVar38->mOffsetMatrix).d4 = fVar3;
                  (paVar38->mOffsetMatrix).c1 = fVar57;
                  (paVar38->mOffsetMatrix).c2 = fVar58;
                  (paVar38->mOffsetMatrix).c3 = fVar59;
                  (paVar38->mOffsetMatrix).c4 = fVar60;
                  (paVar38->mOffsetMatrix).b1 = fVar61;
                  (paVar38->mOffsetMatrix).b2 = fVar62;
                  (paVar38->mOffsetMatrix).b3 = fVar63;
                  (paVar38->mOffsetMatrix).b4 = fVar19;
                  (paVar38->mOffsetMatrix).a1 = fVar20;
                  (paVar38->mOffsetMatrix).a2 = fVar21;
                  (paVar38->mOffsetMatrix).a3 = fVar22;
                  (paVar38->mOffsetMatrix).a4 = fVar23;
                  pBVar48->mMap = local_92c;
                  uVar4 = (pBVar48->mRotationQuat).x;
                  uVar10 = (pBVar48->mRotationQuat).y;
                  (pBVar48->mRotationQuatConverted).x = (float)uVar4;
                  (pBVar48->mRotationQuatConverted).y = (float)uVar10;
                  fVar55 = (pBVar48->mRotationQuat).z;
                  (pBVar48->mRotationQuatConverted).z = fVar55;
                  fVar55 = ((1.0 - (float)uVar4 * (float)uVar4) - (float)uVar10 * (float)uVar10) -
                           fVar55 * fVar55;
                  fVar56 = 0.0;
                  if (0.0 <= fVar55) {
                    if (fVar55 < 0.0) {
                      fVar56 = sqrtf(fVar55);
                    }
                    else {
                      fVar56 = SQRT(fVar55);
                    }
                  }
                  *(float *)((long)&(local_868->mRotationQuatConverted).w + local_870) = -fVar56;
                  local_92c = local_92c + 1;
                  pBVar48 = local_8d0.mJoints.
                            super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pBVar52 = local_8d0.mJoints.
                            super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                uVar33 = (ulong)uVar53;
                uVar47 = ((long)pBVar52 - (long)pBVar48 >> 2) * 0x5bda93fc9916f6a5;
                uVar53 = uVar53 + 1;
              } while (uVar33 <= uVar47 && uVar47 - uVar33 != 0);
            }
            ppaVar24 = local_8e0;
            pVVar36 = (meshSrc->mVertices).
                      super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pVVar36 !=
                (meshSrc->mVertices).
                super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              paVar35 = *local_8e0;
              do {
                paVar35->x = 0.0;
                paVar35->y = 0.0;
                paVar35->z = 0.0;
                uVar53 = pVVar36->mFirstWeight;
                uVar33 = (ulong)uVar53;
                uVar45 = pVVar36->mNumWeights;
                uVar46 = uVar45 + uVar53;
                if (uVar53 < uVar46) {
                  pfVar51 = &(meshSrc->mWeights).
                             super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar33].mWeight;
                  lVar54 = uVar46 - uVar33;
                  fVar55 = 0.0;
                  do {
                    fVar55 = fVar55 + *pfVar51;
                    pfVar51 = pfVar51 + 5;
                    lVar54 = lVar54 + -1;
                  } while (lVar54 != 0);
                  if ((fVar55 == 0.0) && (!NAN(fVar55))) goto LAB_003f2cdb;
                  if (uVar53 < uVar46) {
                    lVar54 = uVar33 * 0x14 + 0x10;
                    do {
                      pWVar17 = (meshSrc->mWeights).
                                super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      uVar47 = ((long)(meshSrc->mWeights).
                                      super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pWVar17 >>
                               2) * -0x3333333333333333;
                      if (uVar47 < uVar33 || uVar47 - uVar33 == 0) {
                        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                        local_838._0_8_ = local_838 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_838,"MD5MESH: Invalid weight index","");
                        std::runtime_error::runtime_error(this_01,(string *)local_838);
                        *(undefined ***)this_01 = &PTR__runtime_error_007dd738;
                        __cxa_throw(this_01,&DeadlyImportError::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      fVar56 = *(float *)((long)pWVar17 + lVar54 + -0xc);
                      if ((1.1920929e-07 <= fVar56) || (fVar56 < -1.1920929e-07)) {
                        uVar45 = *(uint *)((long)pWVar17 + lVar54 + -0x10);
                        fVar3 = *(float *)((long)&pWVar17->mBone + lVar54);
                        uVar5 = local_8d0.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar45].
                                mRotationQuatConverted.w;
                        uVar11 = local_8d0.mJoints.
                                 super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar45].
                                 mRotationQuatConverted.x;
                        uVar6 = local_8d0.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar45].
                                mRotationQuatConverted.y;
                        uVar12 = local_8d0.mJoints.
                                 super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar45].
                                 mRotationQuatConverted.z;
                        uVar9 = *(undefined8 *)((long)pWVar17 + lVar54 + -8);
                        fVar57 = -(float)uVar6;
                        fVar58 = -(float)uVar12;
                        fVar60 = (float)uVar9;
                        fVar63 = (float)((ulong)uVar9 >> 0x20);
                        fVar59 = ((float)uVar12 * fVar60 +
                                 fVar63 * (float)uVar5 + (float)uVar6 * 0.0) - (float)uVar11 * fVar3
                        ;
                        uVar9 = *(undefined8 *)((long)pWVar17 + lVar54 + -4);
                        fVar61 = ((float)uVar9 * (float)uVar11 +
                                 fVar3 * (float)uVar5 + (float)uVar12 * 0.0) - fVar60 * (float)uVar6
                        ;
                        fVar62 = ((float)((ulong)uVar9 >> 0x20) * (float)uVar6 +
                                 fVar60 * (float)uVar5 + (float)uVar11 * 0.0) -
                                 fVar63 * (float)uVar12;
                        fVar60 = fVar58 * fVar3 +
                                 fVar57 * fVar63 + ((float)uVar5 * 0.0 - fVar60 * (float)uVar11);
                        uVar7 = local_8d0.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar45].mPositionXYZ.x;
                        uVar13 = local_8d0.mJoints.
                                 super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar45].mPositionXYZ.y;
                        uVar8 = paVar35->x;
                        uVar14 = paVar35->y;
                        fVar3 = local_8d0.mJoints.
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar45].mPositionXYZ.z;
                        paVar35->x = (float)uVar8 +
                                     fVar56 * ((float)uVar6 * fVar61 +
                                               fVar58 * fVar59 +
                                               -(float)uVar11 * fVar60 + fVar62 * (float)uVar5 +
                                              (float)uVar7);
                        paVar35->y = (float)uVar14 +
                                     fVar56 * ((float)uVar12 * fVar62 +
                                               -(float)uVar11 * fVar61 +
                                               fVar57 * fVar60 + fVar59 * (float)uVar5 +
                                              (float)uVar13);
                        paVar35->z = (fVar59 * (float)uVar11 +
                                      fVar62 * fVar57 + fVar60 * fVar58 + fVar61 * (float)uVar5 +
                                     fVar3) * fVar56 + paVar35->z;
                        paVar18 = *ppaVar24;
                        paVar39 = (*local_8d8)
                                  [local_8d0.mJoints.
                                   super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar45].mMap]->mWeights
                        ;
                        (*local_8d8)
                        [local_8d0.mJoints.
                         super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar45].mMap]->mWeights =
                             paVar39 + 1;
                        paVar39->mVertexId =
                             (int)((ulong)((long)paVar35 - (long)paVar18) >> 2) * -0x55555555;
                        paVar39->mWeight = fVar56 / fVar55;
                        uVar45 = pVVar36->mNumWeights;
                      }
                      uVar33 = uVar33 + 1;
                      lVar54 = lVar54 + 0x14;
                    } while (uVar33 < uVar53 + uVar45);
                  }
                }
                else {
LAB_003f2cdb:
                  pLVar40 = DefaultLogger::get();
                  Logger::error(pLVar40,"MD5MESH: The sum of all vertex bone weights is 0");
                }
                pVVar36 = pVVar36 + 1;
                paVar35 = paVar35 + 1;
              } while (pVVar36 !=
                       (meshSrc->mVertices).
                       super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            __s = local_8f0;
            if (paVar34->mNumBones != 0) {
              uVar33 = 0;
              do {
                ppaVar1 = &paVar34->mBones[uVar33]->mWeights;
                *ppaVar1 = *ppaVar1 + -(ulong)paVar34->mBones[uVar33]->mNumWeights;
                uVar33 = uVar33 + 1;
              } while (uVar33 < paVar34->mNumBones);
            }
          }
          operator_delete__(__s);
          uVar33 = (long)(meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4;
          uVar53 = (uint)uVar33;
          paVar34->mNumFaces = uVar53;
          uVar33 = uVar33 & 0xffffffff;
          puVar41 = (ulong *)operator_new__(uVar33 * 0x10 + 8);
          pMVar50 = local_8f8;
          *puVar41 = uVar33;
          paVar42 = (aiFace *)(puVar41 + 1);
          if (uVar33 != 0) {
            paVar44 = paVar42;
            do {
              paVar44->mNumIndices = 0;
              paVar44->mIndices = (uint *)0x0;
              paVar44 = paVar44 + 1;
            } while (paVar44 != paVar42 + uVar33);
          }
          paVar34->mFaces = paVar42;
          if (uVar53 != 0) {
            lVar54 = 0;
            uVar33 = 0;
            do {
              *(undefined4 *)((long)&paVar34->mFaces->mNumIndices + lVar54) = 3;
              *(undefined8 *)((long)&paVar34->mFaces->mIndices + lVar54) =
                   *(undefined8 *)
                    ((long)&((meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                             _M_impl.super__Vector_impl_data._M_start)->mIndices + lVar54);
              *(undefined8 *)
               ((long)&((meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                        _M_impl.super__Vector_impl_data._M_start)->mIndices + lVar54) = 0;
              uVar33 = uVar33 + 1;
              lVar54 = lVar54 + 0x10;
            } while (uVar33 < paVar34->mNumFaces);
          }
          this_00 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_00);
          __src = local_908;
          pInput = &meshSrc->mShader;
          pMVar50->pScene->mMaterials[local_880] = this_00;
          uVar53 = pInput->length;
          if ((uVar53 == 0) || (pcVar43 = strchr(local_908,0x2e), pcVar43 != (char *)0x0)) {
            aiMaterial::AddProperty(this_00,pInput,"$tex.file",1,0);
          }
          else {
            if (0x3fe < uVar53) {
              uVar53 = 0x3ff;
            }
            local_838._0_4_ = uVar53;
            memcpy(local_838 + 4,__src,(ulong)uVar53);
            local_838[(ulong)uVar53 + 4] = 0;
            aiString::Append((aiString *)local_838,"_local.tga");
            aiMaterial::AddProperty(this_00,(aiString *)local_838,"$tex.file",6,0);
            uVar53 = pInput->length;
            if (0x3fe < pInput->length) {
              uVar53 = 0x3ff;
            }
            uVar33 = (ulong)uVar53;
            local_434 = uVar53;
            memcpy(local_430,local_908,uVar33);
            local_430[uVar33] = 0;
            local_838._0_4_ = uVar53;
            memcpy(local_838 + 4,local_430,uVar33);
            local_838[uVar33 + 4] = 0;
            aiString::Append((aiString *)local_838,"_s.tga");
            aiMaterial::AddProperty(this_00,(aiString *)local_838,"$tex.file",2,0);
            uVar53 = pInput->length;
            if (0x3fe < pInput->length) {
              uVar53 = 0x3ff;
            }
            uVar33 = (ulong)uVar53;
            local_434 = uVar53;
            memcpy(local_430,local_908,uVar33);
            local_430[uVar33] = 0;
            local_838._0_4_ = uVar53;
            memcpy(local_838 + 4,local_430,uVar33);
            local_838[uVar33 + 4] = 0;
            aiString::Append((aiString *)local_838,"_d.tga");
            aiMaterial::AddProperty(this_00,(aiString *)local_838,"$tex.file",1,0);
            uVar53 = pInput->length;
            if (0x3fe < pInput->length) {
              uVar53 = 0x3ff;
            }
            uVar33 = (ulong)uVar53;
            local_434 = uVar53;
            memcpy(local_430,local_908,uVar33);
            local_430[uVar33] = 0;
            local_838._0_4_ = uVar53;
            memcpy(local_838 + 4,local_430,uVar33);
            local_838[uVar33 + 4] = 0;
            aiString::Append((aiString *)local_838,"_h.tga");
            aiMaterial::AddProperty(this_00,(aiString *)local_838,"$tex.file",5,0);
            aiMaterial::AddProperty(this_00,pInput,"?mat.name",0,0);
          }
          this = local_8f8;
          paVar34->mMaterialIndex = local_930;
          if (local_8a0 != local_890) {
            operator_delete(local_8a0,local_890[0] + 1);
          }
          local_930 = local_930 + 1;
        }
        meshSrc = meshSrc + 1;
      } while (meshSrc != local_900);
    }
    if (local_8d0.mJoints.
        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_8d0.mJoints.
                      super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_8d0.mJoints.
                            super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_8d0.mJoints.
                            super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Assimp::MD5::MeshDesc,_std::allocator<Assimp::MD5::MeshDesc>_>::~vector
              (&local_8d0.mMeshes);
    std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::~vector
              (&local_860.mSections);
  }
  if (file != (IOStream *)0x0) {
    (*file->_vptr_IOStream[1])(file);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MD5Importer::LoadMD5MeshFile ()
{
    std::string pFile = mFile + "md5mesh";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL || !file->FileSize())    {
        ASSIMP_LOG_WARN("Failed to access MD5MESH file: " + pFile);
        return;
    }
    bHadMD5Mesh = true;
    LoadFileIntoMemory(file.get());

    // now construct a parser and parse the file
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the mesh information from it
    MD5::MD5MeshParser meshParser(parser.mSections);

    // create the bone hierarchy - first the root node and dummy nodes for all meshes
    pScene->mRootNode = new aiNode("<MD5_Root>");
    pScene->mRootNode->mNumChildren = 2;
    pScene->mRootNode->mChildren = new aiNode*[2];

    // build the hierarchy from the MD5MESH file
    aiNode* pcNode = pScene->mRootNode->mChildren[1] = new aiNode();
    pcNode->mName.Set("<MD5_Hierarchy>");
    pcNode->mParent = pScene->mRootNode;
    AttachChilds_Mesh(-1,pcNode,meshParser.mJoints);

    pcNode = pScene->mRootNode->mChildren[0] = new aiNode();
    pcNode->mName.Set("<MD5_Mesh>");
    pcNode->mParent = pScene->mRootNode;

#if 0
    if (pScene->mRootNode->mChildren[1]->mNumChildren) /* start at the right hierarchy level */
        SkeletonMeshBuilder skeleton_maker(pScene,pScene->mRootNode->mChildren[1]->mChildren[0]);
#else

    // FIX: MD5 files exported from Blender can have empty meshes
    for (std::vector<MD5::MeshDesc>::const_iterator it  = meshParser.mMeshes.begin(),end = meshParser.mMeshes.end(); it != end;++it) {
        if (!(*it).mFaces.empty() && !(*it).mVertices.empty())
            ++pScene->mNumMaterials;
    }

    // generate all meshes
    pScene->mNumMeshes = pScene->mNumMaterials;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes];

    //  storage for node mesh indices
    pcNode->mNumMeshes = pScene->mNumMeshes;
    pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
    for (unsigned int m = 0; m < pcNode->mNumMeshes;++m)
        pcNode->mMeshes[m] = m;

    unsigned int n = 0;
    for (std::vector<MD5::MeshDesc>::iterator it  = meshParser.mMeshes.begin(),end = meshParser.mMeshes.end(); it != end;++it) {
        MD5::MeshDesc& meshSrc = *it;
        if (meshSrc.mFaces.empty() || meshSrc.mVertices.empty())
            continue;

        aiMesh* mesh = pScene->mMeshes[n] = new aiMesh();
        mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // generate unique vertices in our internal verbose format
        MakeDataUnique(meshSrc);

        std::string name( meshSrc.mShader.C_Str() );
        name += ".msh";
        mesh->mName = name;
        mesh->mNumVertices = (unsigned int) meshSrc.mVertices.size();
        mesh->mVertices = new aiVector3D[mesh->mNumVertices];
        mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];
        mesh->mNumUVComponents[0] = 2;

        // copy texture coordinates
        aiVector3D* pv = mesh->mTextureCoords[0];
        for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
            pv->x = (*iter).mUV.x;
            pv->y = 1.0f-(*iter).mUV.y; // D3D to OpenGL
            pv->z = 0.0f;
        }

        // sort all bone weights - per bone
        unsigned int* piCount = new unsigned int[meshParser.mJoints.size()];
        ::memset(piCount,0,sizeof(unsigned int)*meshParser.mJoints.size());

        for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
            for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)
            {
                MD5::WeightDesc& weightDesc = meshSrc.mWeights[w];
                /* FIX for some invalid exporters */
                if (!(weightDesc.mWeight < AI_MD5_WEIGHT_EPSILON && weightDesc.mWeight >= -AI_MD5_WEIGHT_EPSILON ))
                    ++piCount[weightDesc.mBone];
            }
        }

        // check how many we will need
        for (unsigned int p = 0; p < meshParser.mJoints.size();++p)
            if (piCount[p])mesh->mNumBones++;

        if (mesh->mNumBones) // just for safety
        {
            mesh->mBones = new aiBone*[mesh->mNumBones];
            for (unsigned int q = 0,h = 0; q < meshParser.mJoints.size();++q)
            {
                if (!piCount[q])continue;
                aiBone* p = mesh->mBones[h] = new aiBone();
                p->mNumWeights = piCount[q];
                p->mWeights = new aiVertexWeight[p->mNumWeights];
                p->mName = aiString(meshParser.mJoints[q].mName);
                p->mOffsetMatrix = meshParser.mJoints[q].mInvTransform;

                // store the index for later use
                MD5::BoneDesc& boneSrc = meshParser.mJoints[q];
                boneSrc.mMap = h++;

                // compute w-component of quaternion
                MD5::ConvertQuaternion( boneSrc.mRotationQuat, boneSrc.mRotationQuatConverted );
            }

            pv = mesh->mVertices;
            for (MD5::VertexList::const_iterator iter =  meshSrc.mVertices.begin();iter != meshSrc.mVertices.end();++iter,++pv) {
                // compute the final vertex position from all single weights
                *pv = aiVector3D();

                // there are models which have weights which don't sum to 1 ...
                ai_real fSum = 0.0;
                for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)
                    fSum += meshSrc.mWeights[w].mWeight;
                if (!fSum) {
                    ASSIMP_LOG_ERROR("MD5MESH: The sum of all vertex bone weights is 0");
                    continue;
                }

                // process bone weights
                for (unsigned int jub = (*iter).mFirstWeight, w = jub; w < jub + (*iter).mNumWeights;++w)   {
                    if (w >= meshSrc.mWeights.size())
                        throw DeadlyImportError("MD5MESH: Invalid weight index");

                    MD5::WeightDesc& weightDesc = meshSrc.mWeights[w];
                    if ( weightDesc.mWeight < AI_MD5_WEIGHT_EPSILON && weightDesc.mWeight >= -AI_MD5_WEIGHT_EPSILON) {
                        continue;
                    }

                    const ai_real fNewWeight = weightDesc.mWeight / fSum;

                    // transform the local position into worldspace
                    MD5::BoneDesc& boneSrc = meshParser.mJoints[weightDesc.mBone];
                    const aiVector3D v = boneSrc.mRotationQuatConverted.Rotate (weightDesc.vOffsetPosition);

                    // use the original weight to compute the vertex position
                    // (some MD5s seem to depend on the invalid weight values ...)
                    *pv += ((boneSrc.mPositionXYZ+v)* (ai_real)weightDesc.mWeight);

                    aiBone* bone = mesh->mBones[boneSrc.mMap];
                    *bone->mWeights++ = aiVertexWeight((unsigned int)(pv-mesh->mVertices),fNewWeight);
                }
            }

            // undo our nice offset tricks ...
            for (unsigned int p = 0; p < mesh->mNumBones;++p) {
                mesh->mBones[p]->mWeights -= mesh->mBones[p]->mNumWeights;
            }
        }

        delete[] piCount;

        // now setup all faces - we can directly copy the list
        // (however, take care that the aiFace destructor doesn't delete the mIndices array)
        mesh->mNumFaces = (unsigned int)meshSrc.mFaces.size();
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        for (unsigned int c = 0; c < mesh->mNumFaces;++c)   {
            mesh->mFaces[c].mNumIndices = 3;
            mesh->mFaces[c].mIndices = meshSrc.mFaces[c].mIndices;
            meshSrc.mFaces[c].mIndices = NULL;
        }

        // generate a material for the mesh
        aiMaterial* mat = new aiMaterial();
        pScene->mMaterials[n] = mat;

        // insert the typical doom3 textures:
        // nnn_local.tga  - normal map
        // nnn_h.tga      - height map
        // nnn_s.tga      - specular map
        // nnn_d.tga      - diffuse map
        if (meshSrc.mShader.length && !strchr(meshSrc.mShader.data,'.')) {

            aiString temp(meshSrc.mShader);
            temp.Append("_local.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_NORMALS(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_s.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_SPECULAR(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_d.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_DIFFUSE(0));

            temp =  aiString(meshSrc.mShader);
            temp.Append("_h.tga");
            mat->AddProperty(&temp,AI_MATKEY_TEXTURE_HEIGHT(0));

            // set this also as material name
            mat->AddProperty(&meshSrc.mShader,AI_MATKEY_NAME);
        }
        else {
            mat->AddProperty(&meshSrc.mShader, AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
        mesh->mMaterialIndex = n++;
    }
#endif
}